

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

int Getc(FILE *inp)

{
  FILE *in_RDI;
  int local_4;
  
  if (in_RDI == _stdin) {
    if ((pc == (char *)0x0) || (*pc == '\0')) {
      local_4 = 10;
    }
    else {
      local_4 = (int)*pc;
      pc = pc + 1;
    }
  }
  else {
    local_4 = getc(in_RDI);
  }
  return local_4;
}

Assistant:

static int Getc(inp)
	FILE *inp;
{
	if (inp != stdin) {
#if MAC
		int c = getc(inp);
		if (c == '\r') { c  = '\n';}
		return c;
#else
		return getc(inp);
#endif
	}else if (pc && *pc) {
		return (int)(*pc++);
	}else{
		return (int)('\n');
	}
}